

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
push_back<(anonymous_namespace)::ns::Value_const&>
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,Value *val)

{
  allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *__alloc;
  long lVar1;
  allocator_type *__a;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *__first;
  pointer __result;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar2;
  json_runtime_error<std::domain_error,_void> *this_00;
  Value *in_RDX;
  Value *__args;
  allocator<char> local_69;
  size_type local_68;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_60;
  Value *local_58;
  string local_50;
  
  for (; ((byte)*this & 0xf) == 9;
      this = *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> **)(this + 8)) {
  }
  if (((byte)*this & 0xf) == 0xe) {
    lVar1 = *(long *)(this + 8);
    __a = *(allocator_type **)(lVar1 + 0x10);
    if (__a == *(allocator_type **)(lVar1 + 0x18)) {
      __alloc = (allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *)(lVar1 + 8);
      local_58 = val;
      local_68 = std::
                 vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                 ::_M_check_len((vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                                 *)__alloc,1,"vector::_M_realloc_insert");
      __first = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(lVar1 + 8);
      local_60 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                  (lVar1 + 0x10);
      __result = std::
                 _Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                 ::_M_allocate((_Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                                *)__alloc,local_68);
      std::
      allocator_traits<std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
      ::
      construct<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Value_const&>
                ((allocator_type *)(((long)__a - (long)__first) + (long)__result),
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_58,__args
                );
      pbVar2 = std::
               __relocate_a_1<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                         (__first,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                   *)__a,__result,__alloc);
      pbVar2 = std::
               __relocate_a_1<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__a,
                          local_60,pbVar2 + 1,__alloc);
      std::
      _Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
      ::_M_deallocate((_Vector_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                       *)__alloc,__first,*(long *)(lVar1 + 0x18) - (long)__first >> 4);
      *(pointer *)(lVar1 + 8) = __result;
      *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(lVar1 + 0x10) = pbVar2;
      *(pointer *)(lVar1 + 0x18) = __result + local_68;
    }
    else {
      std::
      allocator_traits<std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
      ::
      construct<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,(anonymous_namespace)::ns::Value_const&>
                (__a,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)val,in_RDX)
      ;
      *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + 0x10;
    }
    return;
  }
  this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Attempting to insert into a value that is not an array",&local_69)
  ;
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_50);
  __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

void push_back(T&& val)
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().push_back(std::forward<T>(val));
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().push_back(std::forward<T>(val));
                    break;
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Attempting to insert into a value that is not an array"));
            }
        }